

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::FindPackageStackRAII::~FindPackageStackRAII(FindPackageStackRAII *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmFindPackageCall *pcVar3;
  cmFindPackageCall local_90;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_68;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_58;
  undefined1 local_48 [8];
  cmFindPackageCall top;
  FindPackageStackRAII *this_local;
  
  pcVar3 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                     (&(this->Makefile->FindPackageStack).
                       super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  this->Makefile->FindPackageStackNextIndex = pcVar3->Index + 1;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop
            ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&top.Index);
  cmFindPackageStack::operator=(&this->Makefile->FindPackageStack,(cmFindPackageStack *)&top.Index);
  cmFindPackageStack::~cmFindPackageStack((cmFindPackageStack *)&top.Index);
  bVar2 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                    (&(this->Makefile->FindPackageStack).
                      super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  if (!bVar2) {
    pcVar3 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                       (&(this->Makefile->FindPackageStack).
                         super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
    cmFindPackageCall::cmFindPackageCall((cmFindPackageCall *)local_48,pcVar3);
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop(&local_58);
    cmFindPackageStack::operator=(&this->Makefile->FindPackageStack,(cmFindPackageStack *)&local_58)
    ;
    cmFindPackageStack::~cmFindPackageStack((cmFindPackageStack *)&local_58);
    top.Name.field_2._8_4_ = this->Makefile->FindPackageStackNextIndex;
    this->Makefile->FindPackageStackNextIndex = this->Makefile->FindPackageStackNextIndex + 1;
    pcVar1 = this->Makefile;
    cmFindPackageCall::cmFindPackageCall(&local_90,(cmFindPackageCall *)local_48);
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
              (&local_68,(cmFindPackageCall *)&pcVar1->FindPackageStack);
    cmFindPackageStack::operator=(&this->Makefile->FindPackageStack,(cmFindPackageStack *)&local_68)
    ;
    cmFindPackageStack::~cmFindPackageStack((cmFindPackageStack *)&local_68);
    cmFindPackageCall::~cmFindPackageCall(&local_90);
    cmFindPackageCall::~cmFindPackageCall((cmFindPackageCall *)local_48);
  }
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::~FindPackageStackRAII()
{
  this->Makefile->FindPackageStackNextIndex =
    this->Makefile->FindPackageStack.Top().Index + 1;
  this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

  if (!this->Makefile->FindPackageStack.Empty()) {
    auto top = this->Makefile->FindPackageStack.Top();
    this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

    top.Index = this->Makefile->FindPackageStackNextIndex;
    this->Makefile->FindPackageStackNextIndex++;

    this->Makefile->FindPackageStack =
      this->Makefile->FindPackageStack.Push(top);
  }
}